

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void warn_equality_value(lyxp_expr *exp,lyxp_set *set,uint32_t val_exp,uint32_t equal_exp,
                        uint32_t last_equal_exp)

{
  byte *pbVar1;
  ly_ctx *plVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  ly_err_item *err;
  code *local_60;
  lyd_value storage;
  
  err = (ly_err_item *)0x0;
  if ((set != (lyxp_set *)0x0) && (set->type == LYXP_SET_SCNODE_SET)) {
    uVar6 = set->used;
    do {
      uVar6 = uVar6 - 1;
      if (*(int *)((long)(set->val).nodes + (ulong)uVar6 * 0x18 + 0xc) == 2) {
        pbVar1 = *(byte **)((long)(set->val).nodes + (ulong)uVar6 * 0x18);
        if (pbVar1 == (byte *)0x0) {
          return;
        }
        if ((*pbVar1 & 0xc) == 0) {
          return;
        }
        if (1 < exp->tokens[val_exp] - LYXP_TOKEN_LITERAL) {
          return;
        }
        pcVar7 = exp->expr + exp->tok_pos[val_exp];
        if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
          pcVar7 = pcVar7 + 1;
          uVar6 = exp->tok_len[val_exp] - 2;
        }
        else {
          uVar6 = exp->tok_len[val_exp];
        }
        pcVar7 = strndup(pcVar7,(ulong)uVar6);
        if (pcVar7 == (char *)0x0) {
          ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","warn_equality_value")
          ;
          return;
        }
        lVar8 = *(long *)(pbVar1 + 0x60);
        if (*(int *)(lVar8 + 0x18) == 0xc) {
          pcVar4 = strchr(pcVar7,0x3a);
          if (pcVar4 != (char *)0x0) goto LAB_001a99ed;
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding a prefix or best using \"derived-from(-or-self)()\" functions."
                 ,*(undefined8 *)(pbVar1 + 0x28),pcVar7);
          uVar6 = exp->tok_pos[equal_exp];
          warn_subexpr_log(set->ctx,uVar6,exp->expr + uVar6,
                           (exp->tok_pos[last_equal_exp] - uVar6) + exp->tok_len[last_equal_exp],
                           (set->field_10).cur_scnode);
          lVar8 = *(long *)(pbVar1 + 0x60);
          if (*(int *)(lVar8 + 0x18) == 0xc) goto LAB_001a99ed;
        }
        local_60 = *(code **)(*(long *)(lVar8 + 0x10) + 8);
        plVar2 = set->ctx;
        sVar5 = strlen(pcVar7);
        iVar3 = (*local_60)(plVar2,lVar8,pcVar7,sVar5,0,set->format,set->prefix_data,0x3f3,pbVar1,
                            &storage,0,&err);
        if (iVar3 == 9) {
          iVar3 = 0;
        }
        if (err == (ly_err_item *)0x0) {
          if (iVar3 == 0) goto LAB_001a99d4;
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,"Invalid value \"%s\" which does not fit the type.",
                 pcVar7);
        }
        else {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Invalid value \"%s\" which does not fit the type (%s).",pcVar7,err->msg);
          ly_err_free(err);
          if (iVar3 == 0) {
LAB_001a99d4:
            (**(code **)(*(long *)(lVar8 + 0x10) + 0x38))(set->ctx,&storage);
            goto LAB_001a99ed;
          }
        }
        uVar6 = exp->tok_pos[equal_exp];
        warn_subexpr_log(set->ctx,uVar6,exp->expr + uVar6,
                         (exp->tok_pos[last_equal_exp] - uVar6) + exp->tok_len[last_equal_exp],
                         (set->field_10).cur_scnode);
LAB_001a99ed:
        free(pcVar7);
        return;
      }
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

static void
warn_equality_value(const struct lyxp_expr *exp, struct lyxp_set *set, uint32_t val_exp, uint32_t equal_exp,
        uint32_t last_equal_exp)
{
    struct lysc_node *scnode;
    struct lysc_type *type;
    char *value;
    struct lyd_value storage;
    LY_ERR rc;
    struct ly_err_item *err = NULL;

    if ((scnode = warn_get_scnode_in_ctx(set)) && (scnode->nodetype & (LYS_LEAF | LYS_LEAFLIST)) &&
            ((exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) || (exp->tokens[val_exp] == LYXP_TOKEN_NUMBER))) {
        /* check that the node can have the specified value */
        if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
            value = strndup(exp->expr + exp->tok_pos[val_exp] + 1, exp->tok_len[val_exp] - 2);
        } else {
            value = strndup(exp->expr + exp->tok_pos[val_exp], exp->tok_len[val_exp]);
        }
        if (!value) {
            LOGMEM(set->ctx);
            return;
        }

        if ((((struct lysc_node_leaf *)scnode)->type->basetype == LY_TYPE_IDENT) && !strchr(value, ':')) {
            LOGWRN(set->ctx, "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding"
                    " a prefix or best using \"derived-from(-or-self)()\" functions.", scnode->name, value);
            warn_subexpr_log(set->ctx, exp->tok_pos[equal_exp], exp->expr + exp->tok_pos[equal_exp],
                    (exp->tok_pos[last_equal_exp] - exp->tok_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                    set->cur_scnode);
        }

        type = ((struct lysc_node_leaf *)scnode)->type;
        if (type->basetype != LY_TYPE_IDENT) {
            rc = type->plugin->store(set->ctx, type, value, strlen(value), 0, set->format, set->prefix_data,
                    LYD_HINT_DATA, scnode, &storage, NULL, &err);
            if (rc == LY_EINCOMPLETE) {
                rc = LY_SUCCESS;
            }

            if (err) {
                LOGWRN(set->ctx, "Invalid value \"%s\" which does not fit the type (%s).", value, err->msg);
                ly_err_free(err);
            } else if (rc != LY_SUCCESS) {
                LOGWRN(set->ctx, "Invalid value \"%s\" which does not fit the type.", value);
            }
            if (rc != LY_SUCCESS) {
                warn_subexpr_log(set->ctx, exp->tok_pos[equal_exp], exp->expr + exp->tok_pos[equal_exp],
                        (exp->tok_pos[last_equal_exp] - exp->tok_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                        set->cur_scnode);
            } else {
                type->plugin->free(set->ctx, &storage);
            }
        }
        free(value);
    }
}